

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void lest::shuffle(tests *specification,options option)

{
  iterator __first;
  iterator __last;
  rng local_11;
  tests *ptStack_10;
  rng generator;
  tests *specification_local;
  
  ptStack_10 = specification;
  srand(option.seed);
  __first = std::vector<lest::test,_std::allocator<lest::test>_>::begin(ptStack_10);
  __last = std::vector<lest::test,_std::allocator<lest::test>_>::end(ptStack_10);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,lest::rng>
            ((__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
             )__first._M_current,
             (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
             )__last._M_current,&local_11);
  return;
}

Assistant:

inline void shuffle( tests & specification, options option )
{
#if lest_CPP11_OR_GREATER
    std::shuffle( specification.begin(), specification.end(), std::mt19937( option.seed ) );
#else
    lest::srand( option.seed );

    rng generator;
    std::random_shuffle( specification.begin(), specification.end(), generator );
#endif
}